

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cumain.cpp
# Opt level: O2

void cu_stop_tracing(int param_1)

{
  pointer pSVar1;
  vector<Sample,_std::allocator<Sample>_> *pvVar2;
  map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *pmVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  FILE *__s;
  tm *__tp;
  iterator iVar7;
  ostream *poVar8;
  mapped_type *pmVar9;
  bool bVar10;
  byte bVar11;
  pointer pSVar12;
  size_t sStackY_2b0;
  allocator local_293;
  allocator local_292;
  allocator local_291;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  uint local_26c;
  time_t global_time;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_248;
  char timestr [26];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  char default_path [32];
  utsname uts;
  
  LOCK();
  tracing_enabled._M_base._M_i = (__atomic_base<bool>)false;
  UNLOCK();
  if ((samples != (vector<Sample,_std::allocator<Sample>_> *)0x0) &&
     (symbols_abi_cxx11_ !=
      (map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
       *)0x0)) {
    pcVar6 = getenv("CU_FILE");
    if (pcVar6 == (char *)0x0) {
      uVar4 = getpid();
      pcVar6 = default_path;
      snprintf(pcVar6,0x20,"./culog-%d.json",(ulong)uVar4);
    }
    __s = fopen(pcVar6,"w");
    if (__s == (FILE *)0x0) {
      fprintf(_stderr,"cpuusage: unable to write to output path \'%s\'\n",pcVar6);
    }
    else {
      fwrite("{\n",2,1,__s);
      fwrite("\"otherData\": {\n",0xf,1,__s);
      time(&global_time);
      __tp = localtime(&global_time);
      strftime(timestr,0x1a,"%Y-%m-%d %H:%M:%S %z",__tp);
      std::__cxx11::string::string((string *)&uts,timestr,(allocator *)&local_290);
      fprintf(__s,"  \"timestamp\":\"%s\",\n",uts.sysname._0_8_);
      std::__cxx11::string::~string((string *)&uts);
      iVar5 = uname((utsname *)&uts);
      if (iVar5 == 0) {
        std::__cxx11::string::string((string *)&global_time,uts.sysname,&local_291);
        std::__cxx11::string::string((string *)&local_290," ",&local_292);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)timestr,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &global_time,&local_290);
        std::__cxx11::string::string((string *)&local_248,uts.release,&local_293);
        std::operator+(&local_1f8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)timestr,
                       &local_248);
        std::__cxx11::string::~string((string *)&local_248);
        std::__cxx11::string::~string((string *)timestr);
        std::__cxx11::string::~string((string *)&local_290);
        std::__cxx11::string::~string((string *)&global_time);
      }
      else {
        local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
        local_1f8._M_string_length = 0;
        local_1f8.field_2._M_local_buf[0] = '\0';
      }
      fprintf(__s,"  \"os\":\"%s\",\n",local_1f8._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_1f8);
      uVar4 = std::thread::hardware_concurrency();
      fprintf(__s,"  \"cores\":\"%d\"\n",(ulong)uVar4);
      fwrite("},\n",3,1,__s);
      fwrite("\"traceEvents\": [\n",0x11,1,__s);
      local_26c = getpid();
      pSVar1 = (samples->super__Vector_base<Sample,_std::allocator<Sample>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      bVar10 = true;
      for (pSVar12 = (samples->super__Vector_base<Sample,_std::allocator<Sample>_>)._M_impl.
                     super__Vector_impl_data._M_start; pSVar12 != pSVar1; pSVar12 = pSVar12 + 1) {
        if (bVar10) {
          pcVar6 = "  ";
          sStackY_2b0 = 2;
        }
        else {
          pcVar6 = ",\n  ";
          sStackY_2b0 = 4;
        }
        fwrite(pcVar6,sStackY_2b0,1,__s);
        bVar10 = pSVar12->enter;
        local_248._M_dataplus._M_p = (pointer)pSVar12->func;
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        local_290._M_string_length = 0;
        local_290.field_2._M_local_buf[0] = '\0';
        iVar7 = std::
                _Rb_tree<void_*,_std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&symbols_abi_cxx11_->_M_t,(key_type *)&local_248);
        if ((_Rb_tree_header *)iVar7._M_node ==
            &(symbols_abi_cxx11_->_M_t)._M_impl.super__Rb_tree_header) {
          iVar5 = dladdr(local_248._M_dataplus._M_p,timestr);
          if (timestr._16_8_ == 0 || iVar5 == 0) {
            std::__cxx11::stringstream::stringstream((stringstream *)&uts);
            poVar8 = std::operator<<((ostream *)(uts.sysname + 0x10),"0x");
            *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
                 *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 8;
            std::ostream::_M_insert<unsigned_long_long>((ulonglong)poVar8);
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::operator=((string *)&local_290,(string *)&global_time);
            std::__cxx11::string::~string((string *)&global_time);
            std::__cxx11::stringstream::~stringstream((stringstream *)&uts);
          }
          else {
            if (*(char *)timestr._16_8_ == '_') {
              global_time._0_4_ = -1;
              pcVar6 = (char *)__cxa_demangle(timestr._16_8_,0,0,&global_time);
              if (pcVar6 != (char *)0x0) {
                if ((int)global_time == 0) {
                  std::__cxx11::string::string((string *)&uts,pcVar6,(allocator *)&local_1f8);
                  std::__cxx11::string::operator=((string *)&local_290,(string *)&uts);
                  std::__cxx11::string::~string((string *)&uts);
                }
                free(pcVar6);
              }
            }
            if (local_290._M_string_length == 0) {
              std::__cxx11::string::string
                        ((string *)&uts,(char *)timestr._16_8_,(allocator *)&global_time);
              std::__cxx11::string::operator=((string *)&local_290,(string *)&uts);
              std::__cxx11::string::~string((string *)&uts);
              if (local_290._M_string_length == 0) goto LAB_00103b95;
            }
            std::__cxx11::string::string((string *)&uts," + ",(allocator *)&global_time);
            std::__cxx11::string::append((string *)&local_290);
            std::__cxx11::string::~string((string *)&uts);
            std::__cxx11::to_string
                      ((string *)&uts,(long)local_248._M_dataplus._M_p - stack0xfffffffffffffdf0);
            std::__cxx11::string::append((string *)&local_290);
            std::__cxx11::string::~string((string *)&uts);
          }
LAB_00103b95:
          pmVar9 = std::
                   map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](symbols_abi_cxx11_,(key_type *)&local_248);
          std::__cxx11::string::_M_assign((string *)pmVar9);
        }
        else {
          std::__cxx11::string::_M_assign((string *)&local_290);
        }
        bVar11 = bVar10 ^ 1;
        bVar10 = false;
        fprintf(__s,
                "{ \"ph\":\"%c\", \"cat\":\"perf\", \"pid\":\"%d\", \"tid\":\"%p\", \"name\":\"%s\", \"ts\":%ld }"
                ,(ulong)((uint)bVar11 + (uint)bVar11 * 2 + 0x42),(ulong)local_26c,pSVar12->thread,
                local_290._M_dataplus._M_p,pSVar12->ts);
        std::__cxx11::string::~string((string *)&local_290);
      }
      fputc(10,__s);
      fwrite("]\n",2,1,__s);
      fwrite("}\n",2,1,__s);
      fclose(__s);
    }
    pvVar2 = samples;
    if (samples != (vector<Sample,_std::allocator<Sample>_> *)0x0) {
      std::_Vector_base<Sample,_std::allocator<Sample>_>::~_Vector_base
                (&samples->super__Vector_base<Sample,_std::allocator<Sample>_>);
    }
    operator_delete(pvVar2);
    pmVar3 = symbols_abi_cxx11_;
    if (symbols_abi_cxx11_ !=
        (map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x0) {
      std::
      _Rb_tree<void_*,_std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree(&symbols_abi_cxx11_->_M_t);
    }
    operator_delete(pmVar3);
    samples = (vector<Sample,_std::allocator<Sample>_> *)0x0;
    symbols_abi_cxx11_ =
         (map<void_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x0;
    count_samples = 0;
  }
  return;
}

Assistant:

static void cu_stop_tracing(int)
{
  tracing_enabled = false;

  if ((samples != NULL) && (symbols != NULL))
  {
    cu_trace_report();
    delete samples;
    delete symbols;
    samples = NULL;
    symbols = NULL;
    count_samples = 0;
  }
}